

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

int lws_http_cookie_get(lws *wsi,char *name,char *buf,size_t *max_len)

{
  allocated_headers *paVar1;
  byte bVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  int iVar12;
  char *pcVar13;
  
  sVar11 = *max_len;
  __n = strlen(name);
  paVar1 = (wsi->http).ah;
  uVar8 = 0;
  if ((paVar1 != (allocated_headers *)0x0) &&
     (bVar2 = paVar1->frag_index[0x1a], uVar8 = 0, bVar2 != 0)) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + paVar1->frags[bVar2].len;
      bVar2 = paVar1->frags[bVar2].nfrag;
    } while (bVar2 != 0);
  }
  uVar4 = __n + 1;
  if (uVar8 < uVar4) {
    return 1;
  }
  if (paVar1 != (allocated_headers *)0x0) {
    bVar2 = paVar1->frag_index[0x24];
    if (bVar2 != 0) {
      iVar6 = 0;
      do {
        uVar9 = (ulong)bVar2;
        bVar2 = paVar1->frags[bVar2].nfrag;
        iVar6 = (uint)(bVar2 != 0) + (uint)paVar1->frags[uVar9].len + iVar6;
      } while (bVar2 != 0);
      if (iVar6 != 0) {
        bVar2 = paVar1->frag_index[0x1a];
        if (bVar2 == 0) {
          return -1;
        }
        pcVar13 = paVar1->data;
        while( true ) {
          uVar9 = (ulong)paVar1->frags[bVar2].len;
          uVar10 = uVar9 - uVar4;
          if (((uVar4 <= uVar9) &&
              (pcVar7 = pcVar13 + paVar1->frags[bVar2].offset, pcVar7[__n] == '=')) &&
             (iVar6 = bcmp(pcVar7,name,__n), iVar6 == 0)) break;
          bVar2 = paVar1->frags[bVar2].nfrag;
          if (bVar2 == 0) {
            return -1;
          }
        }
        uVar4 = sVar11 - 1;
        if (uVar10 <= sVar11 - 1) {
          uVar4 = uVar10;
        }
        if (uVar4 != 0) {
          memcpy(buf,pcVar7 + __n + 1,uVar4);
        }
        *max_len = uVar4;
        buf[uVar4] = '\0';
        return 0;
      }
    }
    if ((paVar1 != (allocated_headers *)0x0) && ((ulong)paVar1->frag_index[0x1a] != 0)) {
      pcVar13 = paVar1->data + paVar1->frags[paVar1->frag_index[0x1a]].offset;
      goto LAB_0011deb2;
    }
  }
  pcVar13 = (char *)0x0;
LAB_0011deb2:
  if (pcVar13 != (char *)0x0) {
    iVar6 = (int)__n;
    iVar12 = uVar8 - iVar6;
    if (iVar6 < iVar12) {
      uVar4 = __n & 0xffffffff;
      pcVar7 = pcVar13;
      do {
        if ((pcVar13[__n] == '=') && (iVar3 = bcmp(pcVar7,name,uVar4), iVar3 == 0)) {
          cVar5 = pcVar13[__n + 1];
          pcVar7 = buf;
          if (cVar5 == ';') goto LAB_0011df59;
          goto LAB_0011df3a;
        }
        iVar12 = iVar12 + -1;
        __n = __n + 1;
        pcVar7 = pcVar7 + 1;
      } while (iVar6 < iVar12);
    }
  }
  return 1;
  while( true ) {
    *pcVar7 = cVar5;
    pcVar7 = pcVar7 + 1;
    sVar11 = sVar11 - 1;
    cVar5 = pcVar13[__n + 2];
    __n = __n + 1;
    if (cVar5 == ';') break;
LAB_0011df3a:
    if ((uVar8 - 1 == (int)__n) || (sVar11 == 0)) break;
  }
LAB_0011df59:
  if (sVar11 != 0) {
    *pcVar7 = '\0';
    *max_len = (long)pcVar7 - (long)buf;
    return 0;
  }
  return 2;
}

Assistant:

int
lws_http_cookie_get(struct lws *wsi, const char *name, char *buf,
		    size_t *max_len)
{
	size_t max = *max_len, bl = strlen(name);
	char *p, *bo = buf;
	int n;

	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COOKIE);
	if ((unsigned int)n < bl + 1)
		return 1;

	/*
	 * This can come to us two ways, in ah fragments (h2) or as a single
	 * semicolon-delimited string (h1)
	 */

#if defined(LWS_ROLE_H2)
	if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_METHOD)) {

		/*
		 * The h2 way...
		 */

		int f = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_COOKIE];
		size_t fl;

		while (f) {
			p = wsi->http.ah->data + wsi->http.ah->frags[f].offset;
			fl = (size_t)wsi->http.ah->frags[f].len;
			if (fl >= bl + 1 &&
			    p[bl] == '=' &&
			    !memcmp(p, name, bl)) {
				fl -= bl + 1;
				if (max - 1 < fl)
					fl = max - 1;
				if (fl)
					memcpy(buf, p + bl + 1, fl);
				*max_len = fl;
				buf[fl] = '\0';

				return 0;
			}
			f = wsi->http.ah->frags[f].nfrag;
		}

		return -1;
	}
#endif

	/*
	 * The h1 way...
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COOKIE);
	if (!p)
		return 1;

	p += bl;
	n -= (int)bl;
	while (n-- > (int)bl) {
		if (*p == '=' && !memcmp(p - bl, name, (unsigned int)bl)) {
			p++;
			while (*p != ';' && n-- && max) {
				*buf++ = *p++;
				max--;
			}
			if (!max)
				return 2;

			*buf = '\0';
			*max_len = lws_ptr_diff_size_t(buf, bo);

			return 0;
		}
		p++;
	}

	return 1;
}